

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager_test.cpp
# Opt level: O0

void __thiscall
JobManagerTestSuite_BuildFinalResultString_Test::TestBody
          (JobManagerTestSuite_BuildFinalResultString_Test *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  initializer_list<unsigned_long> __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_10;
  initializer_list<unsigned_char> __l_11;
  bool bVar2;
  int iVar3;
  element_type *peVar4;
  char *pcVar5;
  char *pcVar6;
  CommissionerAppMock *pCVar7;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *this_00;
  TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  *pTVar8;
  _Base_ptr action_1;
  element_type *peVar9;
  MockSpec<bool_()> *pMVar10;
  TypedExpectation<bool_()> *pTVar11;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pMVar12;
  TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *pTVar13;
  reference pvVar14;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> *pMVar15;
  TypedExpectation<ot::commissioner::Error_(unsigned_short_&)> *pTVar16;
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pMVar17;
  TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  *pTVar18;
  MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *pMVar19;
  TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> *pTVar20;
  MockSpec<void_()> *pMVar21;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:611:30),_0UL>
  WVar22;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_3b70;
  SecurityPolicy *local_3b58;
  _Rb_tree_node_base *local_3a90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_3980;
  SecurityPolicy *local_3900;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_37e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_36b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_35d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_34d8;
  string local_31e8;
  AssertHelper local_31c8;
  Message local_31c0;
  undefined1 local_31b8 [8];
  AssertionResult gtest_ar__22;
  AssertHelper local_3188;
  Message local_3180;
  undefined1 local_3178 [8];
  AssertionResult gtest_ar__21;
  AssertHelper local_3148;
  Message local_3140;
  bool local_3131;
  undefined1 local_3130 [8];
  AssertionResult gtest_ar__20;
  AssertHelper local_3100;
  Message local_30f8;
  bool local_30e9;
  undefined1 local_30e8 [8];
  AssertionResult gtest_ar__19;
  string local_30b8;
  input_adapter local_3098;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_3088;
  Value local_3078;
  WithoutMatchers local_3029;
  MockSpec<void_()> local_3028;
  WithoutMatchers local_3011;
  MockSpec<void_()> local_3010;
  AssertHelper local_3000;
  undefined1 local_2ff8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2fe8;
  pointer local_2fe0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *local_2fd8;
  pointer local_2fd0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2fc8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2fab;
  undefined1 local_2faa;
  allocator local_2fa9;
  _Rb_tree_node_base *local_2fa8;
  _Rb_tree_node_base local_2fa0;
  _Rb_tree_node_base *local_2f80;
  _Base_ptr local_2f78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2f70;
  Error local_2f58;
  undefined1 local_2f30 [8];
  AssertionResult gtest_ar_21;
  AssertHelper local_2f00;
  Message local_2ef8;
  undefined1 local_2ef0 [8];
  AssertionResult gtest_ar__18;
  AssertHelper local_2ec0;
  Message local_2eb8;
  undefined1 local_2eb0 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_2e80;
  Message local_2e78;
  bool local_2e69;
  undefined1 local_2e68 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_2e38;
  Message local_2e30;
  bool local_2e21;
  undefined1 local_2e20 [8];
  AssertionResult gtest_ar__15;
  string local_2df0;
  input_adapter local_2dd0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2dc0;
  Value local_2db0;
  Error local_2d68;
  ReturnAction<ot::commissioner::Error> local_2d40;
  anon_class_8_1_088516ce_for_action local_2d30;
  anon_class_8_1_088516ce_for_action local_2d28;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:695:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_2d20;
  Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> local_2d08;
  WithoutMatchers local_2ce1;
  Matcher<const_ot::commissioner::SecurityPolicy_&> local_2ce0;
  MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> local_2cc8;
  Error local_2ca8;
  ReturnAction<ot::commissioner::Error> local_2c80;
  anon_class_8_1_088516ce_for_action local_2c70;
  anon_class_8_1_088516ce_for_action local_2c68;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:693:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_2c60;
  Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> local_2c48;
  WithoutMatchers local_2c21;
  Matcher<const_ot::commissioner::SecurityPolicy_&> local_2c20;
  MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)> local_2c08;
  AssertHelper local_2be8;
  Message local_2be0;
  ErrorCode local_2bd8;
  allocator<unsigned_long> local_2bd1;
  shared_ptr<testing::internal::ExpectationBase> local_2bd0;
  shared_ptr<testing::internal::ExpectationBase> *local_2bc0;
  _func_int **local_2bb8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2bb0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2b97;
  undefined1 local_2b96;
  allocator local_2b95;
  allocator local_2b94;
  allocator local_2b93;
  allocator local_2b92;
  allocator local_2b91;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2b90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b88;
  string local_2b68 [32];
  string local_2b48 [32];
  string local_2b28 [32];
  string local_2b08 [32];
  iterator local_2ae8;
  _func_int **local_2ae0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2ad8;
  Error local_2ac0;
  undefined1 local_2a98 [8];
  AssertionResult gtest_ar_20;
  SecurityPolicy policies [2];
  Message local_2a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a38;
  undefined1 local_2a18 [8];
  AssertionResult gtest_ar_19;
  Message local_2a00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_29f8;
  undefined1 local_29d8 [8];
  AssertionResult gtest_ar_18;
  AssertHelper local_29a8;
  Message local_29a0;
  bool local_2991;
  undefined1 local_2990 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_2960;
  Message local_2958;
  bool local_2949;
  undefined1 local_2948 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_2918;
  Message local_2910;
  bool local_2901;
  undefined1 local_2900 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_28d0;
  Message local_28c8;
  bool local_28b9;
  undefined1 local_28b8 [8];
  AssertionResult gtest_ar__11;
  string local_2888;
  input_adapter local_2868;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_2858;
  Value local_2848;
  Error local_2800;
  ReturnAction<ot::commissioner::Error> local_27d8;
  anon_class_1_0_00000001_for_action local_27c2;
  testing local_27c1;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:672:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_27c0;
  Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_27a8;
  WithoutMatchers local_2781;
  Matcher<unsigned_short> local_2780;
  Matcher<ot::commissioner::ActiveOperationalDataset_&> local_2768;
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_2750;
  Error local_2718;
  ReturnAction<ot::commissioner::Error> local_26f0;
  anon_class_1_0_00000001_for_action local_26da;
  testing local_26d9;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:666:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_26d8;
  Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_26c0;
  WithoutMatchers local_2699;
  Matcher<unsigned_short> local_2698;
  Matcher<ot::commissioner::ActiveOperationalDataset_&> local_2680;
  MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
  local_2668;
  AssertHelper local_2630;
  Message local_2628;
  ErrorCode local_2620;
  allocator<unsigned_long> local_2619;
  _func_int **local_2618;
  void *local_2610;
  _func_int ***local_2608;
  pointer local_2600;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_25f8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_25dd;
  undefined1 local_25dc;
  allocator local_25db;
  allocator local_25da;
  allocator local_25d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_25d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_25d0;
  string local_25b0 [32];
  string local_2590 [32];
  iterator local_2570;
  pointer local_2568;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2560;
  Error local_2548;
  undefined1 local_2520 [8];
  AssertionResult gtest_ar_17;
  Message local_2508;
  int local_24fc;
  undefined1 local_24f8 [8];
  AssertionResult gtest_ar_16;
  Message local_24e0;
  int local_24d4;
  undefined1 local_24d0 [8];
  AssertionResult gtest_ar_15;
  AssertHelper local_24a0;
  Message local_2498;
  bool local_2489;
  undefined1 local_2488 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_2458;
  Message local_2450;
  bool local_2441;
  undefined1 local_2440 [8];
  AssertionResult gtest_ar__9;
  string local_2410;
  input_adapter local_23f0;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_23e0;
  Value local_23d0;
  Error local_2388;
  ReturnAction<ot::commissioner::Error> local_2360;
  anon_class_1_0_00000001_for_action local_234a;
  testing local_2349;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:653:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_2348;
  Action<ot::commissioner::Error_(unsigned_short_&)> local_2330;
  WithoutMatchers local_2309;
  Matcher<unsigned_short_&> local_2308;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_22f0;
  Error local_22d0;
  ReturnAction<ot::commissioner::Error> local_22a8;
  anon_class_1_0_00000001_for_action local_2292;
  testing local_2291;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:651:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_2290;
  Action<ot::commissioner::Error_(unsigned_short_&)> local_2278;
  WithoutMatchers local_2251;
  Matcher<unsigned_short_&> local_2250;
  MockSpec<ot::commissioner::Error_(unsigned_short_&)> local_2238;
  AssertHelper local_2218;
  Message local_2210;
  ErrorCode local_2208;
  allocator<unsigned_long> local_2201;
  shared_ptr<testing::internal::ExpectationBase> local_2200;
  shared_ptr<testing::internal::ExpectationBase> *local_21f0;
  pointer local_21e8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_21e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_21c3;
  undefined1 local_21c2;
  allocator local_21c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_21c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b8;
  iterator local_2198;
  void *local_2190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2188;
  Error local_2170;
  undefined1 local_2148 [8];
  AssertionResult gtest_ar_14;
  AssertHelper local_2118;
  Message local_2110;
  bool local_2101;
  undefined1 local_2100 [8];
  AssertionResult gtest_ar__8;
  AssertHelper local_20d0;
  Message local_20c8;
  undefined1 local_20c0 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_2090;
  Message local_2088;
  undefined1 local_2080 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_2050;
  Message local_2048;
  bool local_2039;
  undefined1 local_2038 [8];
  AssertionResult gtest_ar__5;
  AssertHelper local_2008;
  Message local_2000;
  bool local_1ff1;
  undefined1 local_1ff0 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_1fc0;
  Message local_1fb8;
  bool local_1fa9;
  undefined1 local_1fa8 [8];
  AssertionResult gtest_ar__3;
  string local_1f78;
  input_adapter local_1f58;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_1f48;
  Value local_1f38;
  AssertHelper local_1ef0;
  Message local_1ee8;
  ErrorCode local_1ee0;
  allocator<unsigned_long> local_1ed9;
  pointer local_1ed8;
  pointer psStack_1ed0;
  _func_int **local_1ec8;
  pointer *local_1eb8;
  pointer local_1eb0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1ea8;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8b;
  undefined1 local_1e8a;
  allocator local_1e89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1e88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e80;
  iterator local_1e60;
  pointer local_1e58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e50;
  Error local_1e38;
  undefined1 local_1e10 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_1de0;
  Message local_1dd8;
  bool local_1dc9;
  undefined1 local_1dc8 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_1d98;
  Message local_1d90;
  bool local_1d81;
  undefined1 local_1d80 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_1d50;
  Message local_1d48;
  bool local_1d39;
  undefined1 local_1d38 [8];
  AssertionResult gtest_ar_;
  string local_1d08;
  input_adapter local_1ce8;
  undefined1 local_1cd8 [8];
  json json;
  Value value;
  string local_1c78;
  Error local_1c58;
  ReturnAction<ot::commissioner::Error> local_1c30;
  Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_1c20;
  WithoutMatchers local_1bf9;
  Matcher<unsigned_short> local_1bf8;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1be0;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1bc8;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_1bb0;
  Error local_1b60;
  ReturnAction<ot::commissioner::Error> local_1b38;
  Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_1b28;
  WithoutMatchers local_1b01;
  Matcher<unsigned_short> local_1b00;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1ae8;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_1ad0;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_1ab8;
  Error local_1a68;
  ReturnAction<ot::commissioner::Error> local_1a40;
  Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_1a30;
  WithoutMatchers local_1a09;
  Matcher<unsigned_short> local_1a08;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_19f0;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_19d8;
  MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  local_19c0;
  AssertHelper local_1970;
  Message local_1968;
  ErrorCode local_1960;
  allocator<unsigned_long> local_1959;
  shared_ptr<testing::internal::ExpectationBase> local_1958;
  pointer local_1948;
  shared_ptr<testing::internal::ExpectationBase> *local_1938;
  pointer local_1930;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1928;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190b;
  undefined1 local_190a;
  allocator local_1909;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1900;
  iterator local_18e0;
  void *local_18d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_18d0;
  Error local_18b8;
  undefined1 local_1890 [8];
  AssertionResult gtest_ar_12;
  Action<bool_()> local_1870;
  WithoutMatchers local_1849;
  MockSpec<bool_()> local_1848;
  ReturnAction<bool> local_1838;
  undefined1 local_1828 [32];
  ReturnAction<bool> local_1808;
  Action<bool_()> local_17f8;
  WithoutMatchers local_17d1;
  MockSpec<bool_()> local_17d0;
  ReturnAction<bool> local_17c0;
  undefined1 local_17b0 [32];
  ReturnAction<bool> local_1790;
  Action<bool_()> local_1780;
  WithoutMatchers local_1759;
  MockSpec<bool_()> local_1758;
  Error local_1748;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:611:30),_0UL>
  local_1720;
  anon_class_16_2_c9c4efc7_for_action local_1710;
  _Base_ptr local_1700;
  uint8_t *local_16f8;
  DoAllAction<testing::internal::WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:611:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
  local_16f0;
  undefined1 local_16d0 [40];
  Matcher<const_ot::commissioner::Config_&> local_16a8;
  Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&> local_1690;
  MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
  local_1678;
  pointer local_1640;
  undefined1 local_1638 [8];
  CommissionerAppMockPtr commissionerAppMocks [3];
  undefined1 local_1600 [6];
  uint8_t camIdx;
  AssertHelper local_15e0;
  Message local_15d8;
  int local_15cc;
  undefined1 local_15c8 [8];
  AssertionResult gtest_ar_11;
  Message local_15b0;
  Status local_15a1;
  UnixTime local_15a0;
  allocator local_1591;
  string local_1590;
  allocator local_1569;
  string local_1568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_1548;
  Timestamp local_1538;
  allocator local_1521;
  string local_1520;
  undefined1 local_1500 [16];
  string local_14f0;
  allocator local_14c9;
  string local_14c8;
  allocator local_14a1;
  string local_14a0;
  State local_1480;
  allocator local_1479;
  string local_1478;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1458;
  allocator local_1439;
  string local_1438;
  BorderAgent local_1418;
  BorderRouterId local_129c;
  BorderRouter local_1298;
  Status local_1109;
  undefined1 local_1108 [8];
  AssertionResult gtest_ar_10;
  Message local_10f0;
  int local_10e4;
  undefined1 local_10e0 [8];
  AssertionResult gtest_ar_9;
  Message local_10c8;
  Status local_10ba;
  allocator local_10b9;
  string local_10b8;
  allocator local_1091;
  string local_1090;
  DomainId local_1070;
  NetworkId local_106c;
  Network local_1068;
  Status local_1001;
  undefined1 local_1000 [8];
  AssertionResult gtest_ar_8;
  Message local_fe8;
  int local_fdc;
  undefined1 local_fd8 [8];
  AssertionResult gtest_ar_7;
  Message local_fc0;
  Status local_fb1;
  UnixTime local_fb0;
  allocator local_fa1;
  string local_fa0;
  allocator local_f79;
  string local_f78;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_f58;
  allocator local_f31;
  string local_f30;
  Timestamp local_f10;
  allocator local_f01;
  string local_f00;
  allocator local_ed9;
  string local_ed8;
  allocator local_eb1;
  string local_eb0;
  State local_e90;
  allocator local_e89;
  string local_e88;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_e68;
  allocator local_e49;
  string local_e48;
  BorderAgent local_e28;
  BorderRouterId local_cac;
  BorderRouter local_ca8;
  Status local_b19;
  undefined1 local_b18 [8];
  AssertionResult gtest_ar_6;
  Message local_b00;
  int local_af4;
  undefined1 local_af0 [8];
  AssertionResult gtest_ar_5;
  Message local_ad8;
  Status local_aca;
  allocator local_ac9;
  string local_ac8;
  allocator local_aa1;
  string local_aa0;
  DomainId local_a80;
  NetworkId local_a7c;
  Network local_a78;
  Status local_a11;
  undefined1 local_a10 [8];
  AssertionResult gtest_ar_4;
  Message local_9f8;
  int local_9ec;
  undefined1 local_9e8 [8];
  AssertionResult gtest_ar_3;
  Message local_9d0;
  Status local_9c1;
  UnixTime local_9c0;
  allocator local_9b1;
  string local_9b0;
  allocator local_989;
  string local_988;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_968;
  allocator local_941;
  string local_940;
  Timestamp local_920;
  allocator local_911;
  string local_910;
  allocator local_8e9;
  string local_8e8;
  allocator local_8c1;
  string local_8c0;
  State local_8a0;
  allocator local_899;
  string local_898;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_878;
  allocator local_859;
  string local_858;
  BorderAgent local_838;
  BorderRouterId local_6bc;
  BorderRouter local_6b8;
  Status local_529;
  undefined1 local_528 [8];
  AssertionResult gtest_ar_2;
  Message local_510;
  int local_504;
  undefined1 local_500 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_4e8;
  Message local_4e0;
  Status local_4d2;
  allocator local_4d1;
  string local_4d0;
  allocator local_4a9;
  string local_4a8;
  DomainId local_488;
  NetworkId local_484;
  Network local_480;
  Status local_419;
  undefined1 local_418 [8];
  AssertionResult gtest_ar;
  NetworkId local_400;
  BorderRouterId rid;
  NetworkId nid;
  undefined1 local_3d8 [8];
  TestContext ctx;
  JobManagerTestSuite_BuildFinalResultString_Test *this_local;
  
  ctx.mCommissionerAppStaticExpecter.gmock02_Create_150.super_UntypedFunctionMockerBase.
  untyped_expectations_.
  super__Vector_base<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  JobManagerTestSuite::TestContext::TestContext((TestContext *)local_3d8);
  JobManagerTestSuite::SetInitialExpectations
            (&this->super_JobManagerTestSuite,(TestContext *)local_3d8);
  rid.mId._2_1_ = 0x31;
  rid.mId._3_1_ = 0x30;
  __l_11._M_len = 2;
  __l_11._M_array = (iterator)((long)&rid.mId + 2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             ((long)&ctx.mConf.mId.field_2 + 8),__l_11);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_400);
  ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId
            ((BorderRouterId *)
             ((long)&gtest_ar.message_._M_t.
                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     .
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                     ._M_head_impl + 4));
  peVar4 = std::
           __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_3d8);
  ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_484,0);
  ot::commissioner::persistent_storage::DomainId::DomainId(&local_488,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4a8,"pan1",&local_4a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_4d0,"",&local_4d1);
  ot::commissioner::persistent_storage::Network::Network
            (&local_480,&local_484,&local_488,&local_4a8,1,1,1,&local_4d0,0);
  iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                    (peVar4,&local_480,&local_400);
  local_419 = (Status)iVar3;
  local_4d2 = kSuccess;
  testing::internal::EqHelper::
  Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
            ((EqHelper *)local_418,"ctx.mPS->Add(Network{0, 0, \"pan1\", 1, 1, 0x1, \"\", 0}, nid)",
             "PersistentStorage::Status::kSuccess",&local_419,&local_4d2);
  ot::commissioner::persistent_storage::Network::~Network(&local_480);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4d1);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar2) {
    testing::Message::Message(&local_4e0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
               ,0x238,pcVar5);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    testing::Message::~Message(&local_4e0);
  }
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  if (gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    local_504 = 0;
    testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
              ((EqHelper *)local_500,"nid.mId","0",&local_400.mId,&local_504);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_500);
    if (!bVar2) {
      testing::Message::Message(&local_510);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_500);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x239,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_510);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_510);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_500);
    peVar4 = std::
             __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_3d8);
    ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_6bc,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_858,"127.0.0.1",&local_859);
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_878.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_878);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_898,"1.1",&local_899);
    ot::commissioner::BorderAgent::State::State(&local_8a0,0,0,0,0,0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8c0,"",&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_8e8,"",&local_8e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_910,"",&local_911);
    local_920 = (Timestamp)0x0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_940,"",&local_941);
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_968.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_968);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_988,"",&local_989);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_9b0,"",&local_9b1);
    ot::commissioner::UnixTime::UnixTime(&local_9c0,0);
    ot::commissioner::BorderAgent::BorderAgent
              (&local_838,&local_858,0x4e21,&local_878,&local_898,local_8a0,&local_8c0,0,&local_8e8,
               &local_910,local_920,0,&local_940,&local_968,&local_988,'\0',0,&local_9b0,local_9c0,
               0xf);
    ot::commissioner::persistent_storage::BorderRouter::BorderRouter
              (&local_6b8,&local_6bc,&local_400,&local_838);
    iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                      (peVar4,&local_6b8,
                       (undefined1 *)
                       ((long)&gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl + 4));
    local_529 = (Status)iVar3;
    local_9c1 = kSuccess;
    testing::internal::EqHelper::
    Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
              ((EqHelper *)local_528,
               "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
               ,"PersistentStorage::Status::kSuccess",&local_529,&local_9c1);
    ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_6b8);
    ot::commissioner::BorderAgent::~BorderAgent(&local_838);
    std::__cxx11::string::~string((string *)&local_9b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9b1);
    std::__cxx11::string::~string((string *)&local_988);
    std::allocator<char>::~allocator((allocator<char> *)&local_989);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_968);
    std::__cxx11::string::~string((string *)&local_940);
    std::allocator<char>::~allocator((allocator<char> *)&local_941);
    std::__cxx11::string::~string((string *)&local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    std::__cxx11::string::~string((string *)&local_8e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8e9);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_8c1);
    std::__cxx11::string::~string((string *)&local_898);
    std::allocator<char>::~allocator((allocator<char> *)&local_899);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_878);
    std::__cxx11::string::~string((string *)&local_858);
    std::allocator<char>::~allocator((allocator<char> *)&local_859);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_528);
    if (!bVar2) {
      testing::Message::Message(&local_9d0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_528);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                 ,0x240,pcVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_9d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_9d0);
    }
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_528);
    if (gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      local_9ec = 0;
      testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                ((EqHelper *)local_9e8,"rid.mId","0",
                 (uint *)((long)&gtest_ar.message_._M_t.
                                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 .
                                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                 ._M_head_impl + 4),&local_9ec);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e8);
      if (!bVar2) {
        testing::Message::Message(&local_9f8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_9e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x241,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_9f8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_9f8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e8);
      peVar4 = std::
               __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_3d8);
      ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_a7c,0);
      ot::commissioner::persistent_storage::DomainId::DomainId(&local_a80,0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_aa0,"pan2",&local_aa1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_ac8,"",&local_ac9);
      ot::commissioner::persistent_storage::Network::Network
                (&local_a78,&local_a7c,&local_a80,&local_aa0,2,2,2,&local_ac8,0);
      iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                        (peVar4,&local_a78,&local_400);
      local_a11 = (Status)iVar3;
      local_aca = kSuccess;
      testing::internal::EqHelper::
      Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                ((EqHelper *)local_a10,
                 "ctx.mPS->Add(Network{0, 0, \"pan2\", 2, 2, 0x2, \"\", 0}, nid)",
                 "PersistentStorage::Status::kSuccess",&local_a11,&local_aca);
      ot::commissioner::persistent_storage::Network::~Network(&local_a78);
      std::__cxx11::string::~string((string *)&local_ac8);
      std::allocator<char>::~allocator((allocator<char> *)&local_ac9);
      std::__cxx11::string::~string((string *)&local_aa0);
      std::allocator<char>::~allocator((allocator<char> *)&local_aa1);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a10);
      if (!bVar2) {
        testing::Message::Message(&local_ad8);
        pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_a10);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                   ,0x243,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_ad8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
        testing::Message::~Message(&local_ad8);
      }
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar_1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar2;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a10);
      if (gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_af4 = 1;
        testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                  ((EqHelper *)local_af0,"nid.mId","1",&local_400.mId,&local_af4);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af0);
        if (!bVar2) {
          testing::Message::Message(&local_b00);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_af0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x244,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_b00);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_b00);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_af0);
        peVar4 = std::
                 __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_3d8);
        ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_cac,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e48,"127.0.0.1",&local_e49);
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_e68.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_e68);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e88,"1.1",&local_e89);
        ot::commissioner::BorderAgent::State::State(&local_e90,0,0,0,0,0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_eb0,"",&local_eb1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_ed8,"",&local_ed9);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f00,"",&local_f01);
        local_f10 = (Timestamp)0x0;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f30,"",&local_f31);
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_f58);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_f78,"",&local_f79);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_fa0,"",&local_fa1);
        ot::commissioner::UnixTime::UnixTime(&local_fb0,0);
        ot::commissioner::BorderAgent::BorderAgent
                  (&local_e28,&local_e48,0x4e22,&local_e68,&local_e88,local_e90,&local_eb0,0,
                   &local_ed8,&local_f00,local_f10,0,&local_f30,&local_f58,&local_f78,'\0',0,
                   &local_fa0,local_fb0,0xf);
        ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                  (&local_ca8,&local_cac,&local_400,&local_e28);
        iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                          (peVar4,&local_ca8,
                           (undefined1 *)
                           ((long)&gtest_ar.message_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl + 4));
        local_b19 = (Status)iVar3;
        local_fb1 = kSuccess;
        testing::internal::EqHelper::
        Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                  ((EqHelper *)local_b18,
                   "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20002, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                   ,"PersistentStorage::Status::kSuccess",&local_b19,&local_fb1);
        ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_ca8);
        ot::commissioner::BorderAgent::~BorderAgent(&local_e28);
        std::__cxx11::string::~string((string *)&local_fa0);
        std::allocator<char>::~allocator((allocator<char> *)&local_fa1);
        std::__cxx11::string::~string((string *)&local_f78);
        std::allocator<char>::~allocator((allocator<char> *)&local_f79);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_f58);
        std::__cxx11::string::~string((string *)&local_f30);
        std::allocator<char>::~allocator((allocator<char> *)&local_f31);
        std::__cxx11::string::~string((string *)&local_f00);
        std::allocator<char>::~allocator((allocator<char> *)&local_f01);
        std::__cxx11::string::~string((string *)&local_ed8);
        std::allocator<char>::~allocator((allocator<char> *)&local_ed9);
        std::__cxx11::string::~string((string *)&local_eb0);
        std::allocator<char>::~allocator((allocator<char> *)&local_eb1);
        std::__cxx11::string::~string((string *)&local_e88);
        std::allocator<char>::~allocator((allocator<char> *)&local_e89);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_e68);
        std::__cxx11::string::~string((string *)&local_e48);
        std::allocator<char>::~allocator((allocator<char> *)&local_e49);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b18);
        if (!bVar2) {
          testing::Message::Message(&local_fc0);
          pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_b18);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                     ,0x24b,pcVar5);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_fc0);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_fc0);
        }
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar_1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar2;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_b18);
        if (gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          local_fdc = 1;
          testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                    ((EqHelper *)local_fd8,"rid.mId","1",
                     (uint *)((long)&gtest_ar.message_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl + 4),&local_fdc);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_fd8);
          if (!bVar2) {
            testing::Message::Message(&local_fe8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_fd8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24c,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_fe8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_fe8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_fd8);
          peVar4 = std::
                   __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_3d8);
          ot::commissioner::persistent_storage::NetworkId::NetworkId(&local_106c,0);
          ot::commissioner::persistent_storage::DomainId::DomainId(&local_1070,0);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1090,"pan3",&local_1091);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_10b8,"",&local_10b9);
          ot::commissioner::persistent_storage::Network::Network
                    (&local_1068,&local_106c,&local_1070,&local_1090,3,3,3,&local_10b8,0);
          iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[6])
                            (peVar4,&local_1068,&local_400);
          local_1001 = (Status)iVar3;
          local_10ba = kSuccess;
          testing::internal::EqHelper::
          Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                    ((EqHelper *)local_1000,
                     "ctx.mPS->Add(Network{0, 0, \"pan3\", 3, 3, 0x3, \"\", 0}, nid)",
                     "PersistentStorage::Status::kSuccess",&local_1001,&local_10ba);
          ot::commissioner::persistent_storage::Network::~Network(&local_1068);
          std::__cxx11::string::~string((string *)&local_10b8);
          std::allocator<char>::~allocator((allocator<char> *)&local_10b9);
          std::__cxx11::string::~string((string *)&local_1090);
          std::allocator<char>::~allocator((allocator<char> *)&local_1091);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1000);
          if (!bVar2) {
            testing::Message::Message(&local_10c8);
            pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_1000);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                       ,0x24e,pcVar5);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_10c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_10c8);
          }
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar_1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar2;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1000);
          if (gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            local_10e4 = 2;
            testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                      ((EqHelper *)local_10e0,"nid.mId","2",&local_400.mId,&local_10e4);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_10e0);
            if (!bVar2) {
              testing::Message::Message(&local_10f0);
              pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)local_10e0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x24f,pcVar5);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_10.message_,&local_10f0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
              testing::Message::~Message(&local_10f0);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_10e0);
            peVar4 = std::
                     __shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::persistent_storage::PersistentStorageJson,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_3d8);
            ot::commissioner::persistent_storage::BorderRouterId::BorderRouterId(&local_129c,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1438,"127.0.0.1",&local_1439);
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            local_1458.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_1458);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1478,"1.1",&local_1479);
            ot::commissioner::BorderAgent::State::State(&local_1480,0,0,0,0,0);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14a0,"",&local_14a1);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14c8,"",&local_14c9);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_14f0,"",(allocator *)(local_1500 + 0xf));
            local_1500._0_8_ = (Timestamp)0x0;
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1520,"",&local_1521);
            local_1548._M_allocated_capacity = 0;
            local_1548._8_8_ = 0;
            local_1538 = (Timestamp)0x0;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1548);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1568,"",&local_1569);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_1590,"",&local_1591);
            ot::commissioner::UnixTime::UnixTime(&local_15a0,0);
            pcVar5 = (char *)(ulong)(uint)local_1480;
            ot::commissioner::BorderAgent::BorderAgent
                      (&local_1418,&local_1438,0x4e23,&local_1458,&local_1478,local_1480,&local_14a0
                       ,0,&local_14c8,&local_14f0,(Timestamp)local_1500._0_8_,0,&local_1520,
                       (ByteArray *)&local_1548,&local_1568,'\0',0,&local_1590,local_15a0,0xf);
            ot::commissioner::persistent_storage::BorderRouter::BorderRouter
                      (&local_1298,&local_129c,&local_400,&local_1418);
            iVar3 = (*(peVar4->super_PersistentStorage)._vptr_PersistentStorage[7])
                              (peVar4,&local_1298,
                               (undefined1 *)
                               ((long)&gtest_ar.message_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl + 4));
            local_1109 = (Status)iVar3;
            local_15a1 = kSuccess;
            testing::internal::EqHelper::
            Compare<ot::commissioner::persistent_storage::PersistentStorage::Status,_ot::commissioner::persistent_storage::PersistentStorage::Status,_nullptr>
                      ((EqHelper *)local_1108,
                       "ctx.mPS->Add(BorderRouter{0, nid, BorderAgent{\"127.0.0.1\", 20003, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"\", 0, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"\", 0, 0, \"\", 0, 0x0F}}, rid)"
                       ,"PersistentStorage::Status::kSuccess",&local_1109,&local_15a1);
            ot::commissioner::persistent_storage::BorderRouter::~BorderRouter(&local_1298);
            ot::commissioner::BorderAgent::~BorderAgent(&local_1418);
            std::__cxx11::string::~string((string *)&local_1590);
            std::allocator<char>::~allocator((allocator<char> *)&local_1591);
            std::__cxx11::string::~string((string *)&local_1568);
            std::allocator<char>::~allocator((allocator<char> *)&local_1569);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1548);
            std::__cxx11::string::~string((string *)&local_1520);
            std::allocator<char>::~allocator((allocator<char> *)&local_1521);
            std::__cxx11::string::~string((string *)&local_14f0);
            std::allocator<char>::~allocator((allocator<char> *)(local_1500 + 0xf));
            std::__cxx11::string::~string((string *)&local_14c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_14c9);
            std::__cxx11::string::~string((string *)&local_14a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_14a1);
            std::__cxx11::string::~string((string *)&local_1478);
            std::allocator<char>::~allocator((allocator<char> *)&local_1479);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1458);
            std::__cxx11::string::~string((string *)&local_1438);
            std::allocator<char>::~allocator((allocator<char> *)&local_1439);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1108);
            if (!bVar2) {
              testing::Message::Message(&local_15b0);
              pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1108);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_11.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x256,pcVar6);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_11.message_,&local_15b0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_11.message_);
              testing::Message::~Message(&local_15b0);
            }
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar_1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar2;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1108);
            if (gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              local_15cc = 2;
              testing::internal::EqHelper::Compare<unsigned_int,_int,_nullptr>
                        ((EqHelper *)local_15c8,"rid.mId","2",
                         (uint *)((long)&gtest_ar.message_._M_t.
                                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         .
                                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                         ._M_head_impl + 4),&local_15cc);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_15c8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_15d8);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_15c8);
                testing::internal::AssertHelper::AssertHelper
                          (&local_15e0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,599,pcVar6);
                testing::internal::AssertHelper::operator=(&local_15e0,&local_15d8);
                testing::internal::AssertHelper::~AssertHelper(&local_15e0);
                testing::Message::~Message(&local_15d8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_15c8);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_1600,".",
                         (allocator *)
                         ((long)&commissionerAppMocks[2].
                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              JobManagerTestSuite::Init
                        (&this->super_JobManagerTestSuite,(TestContext *)local_3d8,
                         (string *)local_1600);
              std::__cxx11::string::~string((string *)local_1600);
              std::allocator<char>::~allocator
                        ((allocator<char> *)
                         ((long)&commissionerAppMocks[2].
                                 super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_refcount._M_pi + 7));
              commissionerAppMocks[2].
              super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
              _6_1_ = 0;
              local_1640 = (pointer)local_1638;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)local_1638,pCVar7);
              p_Var1 = &commissionerAppMocks[0].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              local_1640 = (pointer)p_Var1;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)p_Var1,pCVar7);
              p_Var1 = &commissionerAppMocks[1].
                        super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount;
              local_1640 = (pointer)p_Var1;
              pCVar7 = (CommissionerAppMock *)operator_new(0x1838);
              memset(pCVar7,0,0x1838);
              CommissionerAppMock::CommissionerAppMock(pCVar7);
              std::shared_ptr<CommissionerAppMock>::shared_ptr<CommissionerAppMock,void>
                        ((shared_ptr<CommissionerAppMock> *)p_Var1,pCVar7);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1690,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_16a8,(AnythingMatcher *)&testing::_);
              CommissionerAppStaticExpecter::gmock_Create
                        (&local_1678,
                         (CommissionerAppStaticExpecter *)
                         &ctx.mDefaultCommissioner.
                          super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount,&local_1690,&local_16a8);
              testing::internal::GetWithoutMatchers();
              this_00 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                        ::operator()(&local_1678,(WithoutMatchers *)(local_16d0 + 0x27),(void *)0x0)
              ;
              pTVar8 = testing::internal::
                       MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::InternalExpectedAt
                                 (this_00,
                                  "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                  ,0x260,"ctx.mCommissionerAppStaticExpecter","Create(_, _)");
              pTVar8 = testing::internal::
                       TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                       ::Times(pTVar8,3);
              local_1710.commissionerAppMocks = (CommissionerAppMockPtr (*) [3])local_1638;
              local_1710.camIdx =
                   (uint8_t *)
                   ((long)&commissionerAppMocks[2].
                           super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 6);
              WVar22 = testing::
                       WithArg<0ul,JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__0>
                                 (&local_1710);
              local_16f8 = WVar22.action.camIdx;
              action_1 = (_Base_ptr)WVar22.action.commissionerAppMocks;
              local_1700 = action_1;
              ot::commissioner::Error::Error(&local_1748);
              testing::Return<ot::commissioner::Error>((testing *)&local_1720,&local_1748);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__0,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_16f0,(testing *)&local_1700,&local_1720,
                         (ReturnAction<ot::commissioner::Error> *)action_1);
              testing::internal::DoAllAction::operator_cast_to_Action
                        ((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                          *)local_16d0,(DoAllAction *)&local_16f0);
              pCVar7 = (CommissionerAppMock *)local_16d0;
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::WillRepeatedly(pTVar8,(Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                                       *)pCVar7);
              testing::
              Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::~Action((Action<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
                         *)local_16d0);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:611:30),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_16f0);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction
                        ((ReturnAction<ot::commissioner::Error> *)&local_1720);
              ot::commissioner::Error::~Error(&local_1748);
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
              ::~MockSpec(&local_1678);
              testing::Matcher<const_ot::commissioner::Config_&>::~Matcher(&local_16a8);
              testing::Matcher<std::shared_ptr<ot::commissioner::CommissionerApp>_&>::~Matcher
                        (&local_1690);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              local_1758.function_mocker_ =
                   (FunctionMocker<bool_()> *)
                   CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar9,pCVar7);
              testing::internal::GetWithoutMatchers();
              pMVar10 = testing::internal::MockSpec<bool_()>::operator()
                                  (&local_1758,&local_1759,(void *)0x0);
              pTVar11 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  (pMVar10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x265,"*commissionerAppMocks[0]","IsActive()");
              testing::Return<bool>((testing *)&local_1790,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_1780,(ReturnAction *)&local_1790);
              pTVar11 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,&local_1780);
              testing::Return<bool>((testing *)&local_17c0,true);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)local_17b0,(ReturnAction *)&local_17c0);
              pCVar7 = (CommissionerAppMock *)local_17b0;
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar11,(Action<bool_()> *)pCVar7);
              testing::Action<bool_()>::~Action((Action<bool_()> *)local_17b0);
              testing::internal::ReturnAction<bool>::~ReturnAction(&local_17c0);
              testing::Action<bool_()>::~Action(&local_1780);
              testing::internal::ReturnAction<bool>::~ReturnAction(&local_1790);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              local_17d0.function_mocker_ =
                   (FunctionMocker<bool_()> *)
                   CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar9,pCVar7);
              testing::internal::GetWithoutMatchers();
              pMVar10 = testing::internal::MockSpec<bool_()>::operator()
                                  (&local_17d0,&local_17d1,(void *)0x0);
              pTVar11 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  (pMVar10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x266,"*commissionerAppMocks[1]","IsActive()");
              testing::Return<bool>((testing *)&local_1808,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_17f8,(ReturnAction *)&local_1808);
              pTVar11 = testing::internal::TypedExpectation<bool_()>::WillOnce(pTVar11,&local_17f8);
              testing::Return<bool>((testing *)&local_1838,true);
              testing::internal::ReturnAction::operator_cast_to_Action
                        ((Action<bool_()> *)local_1828,(ReturnAction *)&local_1838);
              pCVar7 = (CommissionerAppMock *)local_1828;
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly
                        (pTVar11,(Action<bool_()> *)pCVar7);
              testing::Action<bool_()>::~Action((Action<bool_()> *)local_1828);
              testing::internal::ReturnAction<bool>::~ReturnAction(&local_1838);
              testing::Action<bool_()>::~Action(&local_17f8);
              testing::internal::ReturnAction<bool>::~ReturnAction(&local_1808);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[1].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              local_1848.function_mocker_ =
                   (FunctionMocker<bool_()> *)
                   CommissionerAppMock::gmock_IsActive((MockSpec<bool_()> *)peVar9,pCVar7);
              testing::internal::GetWithoutMatchers();
              pMVar10 = testing::internal::MockSpec<bool_()>::operator()
                                  (&local_1848,&local_1849,(void *)0x0);
              pTVar11 = testing::internal::MockSpec<bool_()>::InternalExpectedAt
                                  (pMVar10,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x267,"*commissionerAppMocks[2]","IsActive()");
              testing::Return<bool>((testing *)&gtest_ar_12.message_,false);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_1870,(ReturnAction *)&gtest_ar_12.message_);
              testing::internal::TypedExpectation<bool_()>::WillRepeatedly(pTVar11,&local_1870);
              testing::Action<bool_()>::~Action(&local_1870);
              testing::internal::ReturnAction<bool>::~ReturnAction
                        ((ReturnAction<bool> *)&gtest_ar_12.message_);
              local_190a = 1;
              local_1908 = &local_1900;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1900,"start",&local_1909);
              local_190a = 0;
              local_18e0 = &local_1900;
              local_18d8 = (void *)0x1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_190b);
              __l_10._M_len = (size_type)local_18d8;
              __l_10._M_array = local_18e0;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_18d0,__l_10,&local_190b);
              local_1958.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x1;
              local_1958.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_1948 = (pointer)0x3;
              local_1938 = &local_1958;
              local_1930 = (pointer)0x3;
              std::allocator<unsigned_long>::allocator(&local_1959);
              __l_09._M_len = (size_type)local_1930;
              __l_09._M_array = (iterator)local_1938;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_1928,__l_09,&local_1959);
              ot::commissioner::JobManager::PrepareJobs
                        (&local_18b8,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_18d0,
                         &local_1928,false);
              local_1960 = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_1890,
                         "ctx.mJobManager.PrepareJobs({\"start\"}, {0x1, 0x02, 0x03}, false).mCode",
                         "ErrorCode::kNone",&local_18b8.mCode,&local_1960);
              ot::commissioner::Error::~Error(&local_18b8);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1928);
              std::allocator<unsigned_long>::~allocator(&local_1959);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_18d0);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_190b);
              local_34d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_18e0;
              do {
                local_34d8 = local_34d8 + -1;
                std::__cxx11::string::~string((string *)local_34d8);
              } while (local_34d8 != &local_1900);
              std::allocator<char>::~allocator((allocator<char> *)&local_1909);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1890)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1968);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1890);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1970,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x269,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1970,&local_1968);
                testing::internal::AssertHelper::~AssertHelper(&local_1970);
                testing::Message::~Message(&local_1968);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1890);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_19d8,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_19f0,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1a08,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_Start
                        (&local_19c0,peVar9,&local_19d8,&local_19f0,&local_1a08);
              testing::internal::GetWithoutMatchers();
              pMVar12 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::operator()(&local_19c0,&local_1a09,(void *)0x0);
              pTVar13 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar12,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26b,"*commissionerAppMocks[0]","Start(_, _, _)");
              pTVar13 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar13,1);
              ot::commissioner::Error::Error(&local_1a68);
              testing::Return<ot::commissioner::Error>((testing *)&local_1a40,&local_1a68);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_1a30,(ReturnAction *)&local_1a40);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar13,&local_1a30);
              testing::
              Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~Action(&local_1a30);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_1a40);
              ot::commissioner::Error::~Error(&local_1a68);
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~MockSpec(&local_19c0);
              testing::Matcher<unsigned_short>::~Matcher(&local_1a08);
              testing::
              Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_19f0);
              testing::
              Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_19d8);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1ad0,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1ae8,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1b00,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_Start
                        (&local_1ab8,peVar9,&local_1ad0,&local_1ae8,&local_1b00);
              testing::internal::GetWithoutMatchers();
              pMVar12 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::operator()(&local_1ab8,&local_1b01,(void *)0x0);
              pTVar13 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar12,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26c,"*commissionerAppMocks[1]","Start(_, _, _)");
              pTVar13 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar13,1);
              ot::commissioner::Error::Error(&local_1b60);
              testing::Return<ot::commissioner::Error>((testing *)&local_1b38,&local_1b60);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_1b28,(ReturnAction *)&local_1b38);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar13,&local_1b28);
              testing::
              Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~Action(&local_1b28);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_1b38);
              ot::commissioner::Error::~Error(&local_1b60);
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~MockSpec(&local_1ab8);
              testing::Matcher<unsigned_short>::~Matcher(&local_1b00);
              testing::
              Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_1ae8);
              testing::
              Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_1ad0);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[1].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1bc8,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1be0,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_1bf8,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_Start
                        (&local_1bb0,peVar9,&local_1bc8,&local_1be0,&local_1bf8);
              testing::internal::GetWithoutMatchers();
              pMVar12 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::operator()(&local_1bb0,&local_1bf9,(void *)0x0);
              pTVar13 = testing::internal::
                        MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar12,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x26d,"*commissionerAppMocks[2]","Start(_, _, _)");
              pTVar13 = testing::internal::
                        TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
                        ::Times(pTVar13,1);
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_1c78,"Aborted",
                         (allocator *)(value.mData.field_2._M_local_buf + 0xf));
              ot::commissioner::Error::Error(&local_1c58,kAborted,&local_1c78);
              testing::Return<ot::commissioner::Error>((testing *)&local_1c30,&local_1c58);
              testing::internal::ReturnAction::operator_cast_to_Action
                        (&local_1c20,(ReturnAction *)&local_1c30);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::WillOnce(pTVar13,&local_1c20);
              testing::
              Action<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~Action(&local_1c20);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_1c30);
              ot::commissioner::Error::~Error(&local_1c58);
              std::__cxx11::string::~string((string *)&local_1c78);
              std::allocator<char>::~allocator
                        ((allocator<char> *)(value.mData.field_2._M_local_buf + 0xf));
              testing::internal::
              MockSpec<ot::commissioner::Error_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
              ::~MockSpec(&local_1bb0);
              testing::Matcher<unsigned_short>::~Matcher(&local_1bf8);
              testing::
              Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_1be0);
              testing::
              Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              ::~Matcher(&local_1bc8);
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        ((Value *)&json.m_value,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_1d08,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_1ce8,&local_1d08);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar_.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                       *)local_1cd8,&local_1ce8,(parser_callback_t *)&gtest_ar_.message_,true);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar_.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_1ce8);
              std::__cxx11::string::~string((string *)&local_1d08);
              local_1d39 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1d38,&local_1d39,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d38)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1d48);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__1.message_,(internal *)local_1d38,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1d50,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x276,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1d50,&local_1d48);
                testing::internal::AssertHelper::~AssertHelper(&local_1d50);
                std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
                testing::Message::~Message(&local_1d48);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d38);
              local_1d81 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1d80,&local_1d81,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d80)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1d90);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__2.message_,(internal *)local_1d80,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1d98,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x277,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1d98,&local_1d90);
                testing::internal::AssertHelper::~AssertHelper(&local_1d98);
                std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
                testing::Message::~Message(&local_1d90);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d80);
              bVar2 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::contains<const_char_(&)[19],_0>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                  *)local_1cd8,(char (*) [19])"0x0000000000000003");
              local_1dc9 = (bool)(~bVar2 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1dc8,&local_1dc9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1dc8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1dd8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_13.message_,(internal *)local_1dc8,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","true","false"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1de0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x278,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1de0,&local_1dd8);
                testing::internal::AssertHelper::~AssertHelper(&local_1de0);
                std::__cxx11::string::~string((string *)&gtest_ar_13.message_);
                testing::Message::~Message(&local_1dd8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1dc8);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_1e8a = 1;
              local_1e88 = &local_1e80;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_1e80,"active",&local_1e89);
              local_1e8a = 0;
              local_1e60 = &local_1e80;
              local_1e58 = (pointer)0x1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_1e8b);
              __l_08._M_len = (size_type)local_1e58;
              __l_08._M_array = local_1e60;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_1e50,__l_08,&local_1e8b);
              local_1ed8 = (pointer)0x1;
              psStack_1ed0 = (pointer)0x2;
              local_1ec8 = (_func_int **)0x3;
              local_1eb8 = &local_1ed8;
              local_1eb0 = (pointer)0x3;
              std::allocator<unsigned_long>::allocator(&local_1ed9);
              __l_07._M_len = (size_type)local_1eb0;
              __l_07._M_array = (iterator)local_1eb8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_1ea8,__l_07,&local_1ed9);
              ot::commissioner::JobManager::PrepareJobs
                        (&local_1e38,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_1e50,
                         &local_1ea8,false);
              local_1ee0 = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_1e10,
                         "ctx.mJobManager.PrepareJobs({\"active\"}, {0x1, 0x2, 0x3}, false).mCode",
                         "ErrorCode::kNone",&local_1e38.mCode,&local_1ee0);
              ot::commissioner::Error::~Error(&local_1e38);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_1ea8);
              std::allocator<unsigned_long>::~allocator(&local_1ed9);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_1e50);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_1e8b);
              local_35d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1e60;
              do {
                local_35d8 = local_35d8 + -1;
                std::__cxx11::string::~string((string *)local_35d8);
              } while (local_35d8 != &local_1e80);
              std::allocator<char>::~allocator((allocator<char> *)&local_1e89);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e10)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1ee8);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1e10);
                testing::internal::AssertHelper::AssertHelper
                          (&local_1ef0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x27c,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1ef0,&local_1ee8);
                testing::internal::AssertHelper::~AssertHelper(&local_1ef0);
                testing::Message::~Message(&local_1ee8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e10);
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        (&local_1f38,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::operator=((Value *)&json.m_value,&local_1f38);
              ot::commissioner::Interpreter::Value::~Value(&local_1f38);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_1f78,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_1f58,&local_1f78);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar__3.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_1f48,&local_1f58,(parser_callback_t *)&gtest_ar__3.message_,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_1cd8,&local_1f48);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_1f48);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar__3.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_1f58);
              std::__cxx11::string::~string((string *)&local_1f78);
              local_1fa9 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1fa8,&local_1fa9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1fa8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_1fb8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__4.message_,(internal *)local_1fa8,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_1fc0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x280,pcVar6);
                testing::internal::AssertHelper::operator=(&local_1fc0,&local_1fb8);
                testing::internal::AssertHelper::~AssertHelper(&local_1fc0);
                std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
                testing::Message::~Message(&local_1fb8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1fa8);
              local_1ff1 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_1ff0,&local_1ff1,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1ff0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2000);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__5.message_,(internal *)local_1ff0,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2008,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x281,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2008,&local_2000);
                testing::internal::AssertHelper::~AssertHelper(&local_2008);
                std::__cxx11::string::~string((string *)&gtest_ar__5.message_);
                testing::Message::~Message(&local_2000);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1ff0);
              local_2039 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000003");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2038,&local_2039,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2038)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2048);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_2038,
                           (AssertionResult *)"json.contains(\"0x0000000000000003\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2050,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x282,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2050,&local_2048);
                testing::internal::AssertHelper::~AssertHelper(&local_2050);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_2048);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2038);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_2080,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2080)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2088);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_2080,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2090,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x283,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2090,&local_2088);
                testing::internal::AssertHelper::~AssertHelper(&local_2090);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_2088);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2080);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_20c0,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20c0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_20c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__8.message_,(internal *)local_20c0,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_20d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x284,pcVar6);
                testing::internal::AssertHelper::operator=(&local_20d0,&local_20c8);
                testing::internal::AssertHelper::~AssertHelper(&local_20d0);
                std::__cxx11::string::~string((string *)&gtest_ar__8.message_);
                testing::Message::~Message(&local_20c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_20c0);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000003");
              bVar2 = nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::operator_bool<bool,_0>(pvVar14);
              local_2101 = (bool)(~bVar2 & 1);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2100,&local_2101,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2100)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2110);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_14.message_,(internal *)local_2100,
                           (AssertionResult *)"json[\"0x0000000000000003\"]","true","false",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2118,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x285,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2118,&local_2110);
                testing::internal::AssertHelper::~AssertHelper(&local_2118);
                std::__cxx11::string::~string((string *)&gtest_ar_14.message_);
                testing::Message::~Message(&local_2110);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2100);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_21c2 = 1;
              local_21c0 = &local_21b8;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_21b8,"sessionid",&local_21c1);
              local_21c2 = 0;
              local_2198 = &local_21b8;
              local_2190 = (void *)0x1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_21c3);
              __l_06._M_len = (size_type)local_2190;
              __l_06._M_array = local_2198;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_2188,__l_06,&local_21c3);
              local_2200.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x1;
              local_2200.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_21f0 = &local_2200;
              local_21e8 = (pointer)0x2;
              std::allocator<unsigned_long>::allocator(&local_2201);
              __l_05._M_len = (size_type)local_21e8;
              __l_05._M_array = (iterator)local_21f0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_21e0,__l_05,&local_2201);
              ot::commissioner::JobManager::PrepareJobs
                        (&local_2170,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_2188,
                         &local_21e0,false);
              local_2208 = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_2148,
                         "ctx.mJobManager.PrepareJobs({\"sessionid\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",&local_2170.mCode,&local_2208);
              ot::commissioner::Error::~Error(&local_2170);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_21e0);
              std::allocator<unsigned_long>::~allocator(&local_2201);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2188);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_21c3);
              local_36b8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2198;
              do {
                local_36b8 = local_36b8 + -1;
                std::__cxx11::string::~string((string *)local_36b8);
              } while (local_36b8 != &local_21b8);
              std::allocator<char>::~allocator((allocator<char> *)&local_21c1);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2148)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2210);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2148);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2218,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x289,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2218,&local_2210);
                testing::internal::AssertHelper::~AssertHelper(&local_2218);
                testing::Message::~Message(&local_2210);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2148);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2250,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_GetSessionId(&local_2238,peVar9,&local_2250);
              testing::internal::GetWithoutMatchers();
              pMVar15 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        operator()(&local_2238,&local_2251,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[0]";
              pTVar16 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt(pMVar15,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28a,"*commissionerAppMocks[0]","GetSessionId(_)");
              testing::WithArg<0ul,JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__1>
                        (&local_2292);
              ot::commissioner::Error::Error(&local_22d0);
              testing::Return<ot::commissioner::Error>((testing *)&local_22a8,&local_22d0);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__1,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_2290,&local_2291,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:651:36),_0UL>
                          *)&local_22a8,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_2278,(DoAllAction *)&local_2290);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar16,&local_2278);
              testing::Action<ot::commissioner::Error_(unsigned_short_&)>::~Action(&local_2278);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:651:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_2290);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_22a8);
              ot::commissioner::Error::~Error(&local_22d0);
              testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::~MockSpec
                        (&local_2238);
              testing::Matcher<unsigned_short_&>::~Matcher(&local_2250);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2308,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_GetSessionId(&local_22f0,peVar9,&local_2308);
              testing::internal::GetWithoutMatchers();
              pMVar15 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        operator()(&local_22f0,&local_2309,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[1]";
              pTVar16 = testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::
                        InternalExpectedAt(pMVar15,
                                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                           ,0x28c,"*commissionerAppMocks[1]","GetSessionId(_)");
              testing::WithArg<0ul,JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__2>
                        (&local_234a);
              ot::commissioner::Error::Error(&local_2388);
              testing::Return<ot::commissioner::Error>((testing *)&local_2360,&local_2388);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__2,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_2348,&local_2349,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:653:36),_0UL>
                          *)&local_2360,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_2330,(DoAllAction *)&local_2348);
              testing::internal::TypedExpectation<ot::commissioner::Error_(unsigned_short_&)>::
              WillOnce(pTVar16,&local_2330);
              testing::Action<ot::commissioner::Error_(unsigned_short_&)>::~Action(&local_2330);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:653:36),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_2348);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_2360);
              ot::commissioner::Error::~Error(&local_2388);
              testing::internal::MockSpec<ot::commissioner::Error_(unsigned_short_&)>::~MockSpec
                        (&local_22f0);
              testing::Matcher<unsigned_short_&>::~Matcher(&local_2308);
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        (&local_23d0,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::operator=((Value *)&json.m_value,&local_23d0);
              ot::commissioner::Interpreter::Value::~Value(&local_23d0);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_2410,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_23f0,&local_2410);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar__9.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_23e0,&local_23f0,(parser_callback_t *)&gtest_ar__9.message_,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_1cd8,&local_23e0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_23e0);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar__9.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_23f0);
              std::__cxx11::string::~string((string *)&local_2410);
              local_2441 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2440,&local_2441,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2440)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2450);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__10.message_,(internal *)local_2440,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2458,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x291,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2458,&local_2450);
                testing::internal::AssertHelper::~AssertHelper(&local_2458);
                std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                testing::Message::~Message(&local_2450);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2440);
              local_2489 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2488,&local_2489,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2488)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2498);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_15.message_,(internal *)local_2488,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_24a0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x292,pcVar6);
                testing::internal::AssertHelper::operator=(&local_24a0,&local_2498);
                testing::internal::AssertHelper::~AssertHelper(&local_24a0);
                std::__cxx11::string::~string((string *)&gtest_ar_15.message_);
                testing::Message::~Message(&local_2498);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2488);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              local_24d4 = 0;
              testing::internal::EqHelper::
              Compare<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_nullptr>
                        ((EqHelper *)local_24d0,"json[\"0x0000000000000001\"]","0",pvVar14,
                         &local_24d4);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24d0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_24e0);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_24d0);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_16.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x293,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_16.message_,&local_24e0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_16.message_);
                testing::Message::~Message(&local_24e0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_24d0);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              local_24fc = 1;
              testing::internal::EqHelper::
              Compare<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_nullptr>
                        ((EqHelper *)local_24f8,"json[\"0x0000000000000002\"]","1",pvVar14,
                         &local_24fc);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_24f8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2508);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_24f8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_17.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x294,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_17.message_,&local_2508);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_17.message_);
                testing::Message::~Message(&local_2508);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_24f8);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_25dc = 1;
              local_25d8 = &local_25d0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_25d0,"opdataset",&local_25d9);
              local_25d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_25b0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_25b0,"get",&local_25da);
              local_25d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2590;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2590,"active",&local_25db);
              local_25dc = 0;
              local_2570 = &local_25d0;
              local_2568 = (pointer)0x3;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_25dd);
              __l_04._M_len = (size_type)local_2568;
              __l_04._M_array = local_2570;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_2560,__l_04,&local_25dd);
              local_2618 = (_func_int **)0x1;
              local_2610 = (void *)0x2;
              local_2608 = &local_2618;
              local_2600 = (pointer)0x2;
              std::allocator<unsigned_long>::allocator(&local_2619);
              __l_03._M_len = (size_type)local_2600;
              __l_03._M_array = (iterator)local_2608;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_25f8,__l_03,&local_2619);
              ot::commissioner::JobManager::PrepareJobs
                        (&local_2548,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_2560,
                         &local_25f8,false);
              local_2620 = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_2520,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"get\", \"active\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",&local_2548.mCode,&local_2620);
              ot::commissioner::Error::~Error(&local_2548);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_25f8);
              std::allocator<unsigned_long>::~allocator(&local_2619);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2560);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_25dd);
              local_37e8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2570;
              do {
                local_37e8 = local_37e8 + -1;
                std::__cxx11::string::~string((string *)local_37e8);
              } while (local_37e8 != &local_25d0);
              std::allocator<char>::~allocator((allocator<char> *)&local_25db);
              std::allocator<char>::~allocator((allocator<char> *)&local_25da);
              std::allocator<char>::~allocator((allocator<char> *)&local_25d9);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2520)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2628);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2520);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2630,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x298,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2630,&local_2628);
                testing::internal::AssertHelper::~AssertHelper(&local_2630);
                testing::Message::~Message(&local_2628);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2520);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2680,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2698,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_GetActiveDataset
                        (&local_2668,peVar9,&local_2680,&local_2698);
              testing::internal::GetWithoutMatchers();
              pMVar17 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::operator()(&local_2668,&local_2699,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[0]";
              pTVar18 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar17,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x299,"*commissionerAppMocks[0]","GetActiveDataset(_, _)");
              testing::
              WithArgs<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:666:37)>
                        (&local_26da);
              ot::commissioner::Error::Error(&local_2718);
              testing::Return<ot::commissioner::Error>((testing *)&local_26f0,&local_2718);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__3,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_26d8,&local_26d9,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:666:37),_0UL>
                          *)&local_26f0,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_26c0,(DoAllAction *)&local_26d8);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar18,&local_26c0);
              testing::
              Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::~Action(&local_26c0);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:666:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_26d8);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_26f0);
              ot::commissioner::Error::~Error(&local_2718);
              testing::internal::
              MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::~MockSpec(&local_2668);
              testing::Matcher<unsigned_short>::~Matcher(&local_2698);
              testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>::~Matcher(&local_2680);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2768,(AnythingMatcher *)&testing::_);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2780,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_GetActiveDataset
                        (&local_2750,peVar9,&local_2768,&local_2780);
              testing::internal::GetWithoutMatchers();
              pMVar17 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::operator()(&local_2750,&local_2781,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[1]";
              pTVar18 = testing::internal::
                        MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
                        ::InternalExpectedAt
                                  (pMVar17,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x29f,"*commissionerAppMocks[1]","GetActiveDataset(_, _)");
              testing::
              WithArgs<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:672:37)>
                        (&local_27c2);
              ot::commissioner::Error::Error(&local_2800);
              testing::Return<ot::commissioner::Error>((testing *)&local_27d8,&local_2800);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__4,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_27c0,&local_27c1,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:672:37),_0UL>
                          *)&local_27d8,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_27a8,(DoAllAction *)&local_27c0);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::WillOnce(pTVar18,&local_27a8);
              testing::
              Action<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::~Action(&local_27a8);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:672:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_27c0);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_27d8);
              ot::commissioner::Error::~Error(&local_2800);
              testing::internal::
              MockSpec<ot::commissioner::Error_(ot::commissioner::ActiveOperationalDataset_&,_unsigned_short)>
              ::~MockSpec(&local_2750);
              testing::Matcher<unsigned_short>::~Matcher(&local_2780);
              testing::Matcher<ot::commissioner::ActiveOperationalDataset_&>::~Matcher(&local_2768);
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        (&local_2848,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::operator=((Value *)&json.m_value,&local_2848);
              ot::commissioner::Interpreter::Value::~Value(&local_2848);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_2888,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2868,&local_2888);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar__11.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_2858,&local_2868,(parser_callback_t *)&gtest_ar__11.message_,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_1cd8,&local_2858);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_2858);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar__11.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_2868);
              std::__cxx11::string::~string((string *)&local_2888);
              local_28b9 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_28b8,&local_28b9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28b8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_28c8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__12.message_,(internal *)local_28b8,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_28d0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a8,pcVar6);
                testing::internal::AssertHelper::operator=(&local_28d0,&local_28c8);
                testing::internal::AssertHelper::~AssertHelper(&local_28d0);
                std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                testing::Message::~Message(&local_28c8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_28b8);
              local_2901 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2900,&local_2901,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2900)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2910);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__13.message_,(internal *)local_2900,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2918,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2a9,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2918,&local_2910);
                testing::internal::AssertHelper::~AssertHelper(&local_2918);
                std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                testing::Message::~Message(&local_2910);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2900);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              local_2949 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[6],_0>(pvVar14,(char (*) [6])0x3a0f19);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2948,&local_2949,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2948)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2958);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__14.message_,(internal *)local_2948,
                           (AssertionResult *)"json[\"0x0000000000000001\"].contains(\"PanId\")",
                           "false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2960,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2aa,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2960,&local_2958);
                testing::internal::AssertHelper::~AssertHelper(&local_2960);
                std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                testing::Message::~Message(&local_2958);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2948);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              local_2991 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[6],_0>(pvVar14,(char (*) [6])0x3a0f19);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2990,&local_2991,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2990)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_29a0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_18.message_,(internal *)local_2990,
                           (AssertionResult *)"json[\"0x0000000000000002\"].contains(\"PanId\")",
                           "false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_29a8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ab,pcVar6);
                testing::internal::AssertHelper::operator=(&local_29a8,&local_29a0);
                testing::internal::AssertHelper::~AssertHelper(&local_29a8);
                std::__cxx11::string::~string((string *)&gtest_ar_18.message_);
                testing::Message::~Message(&local_29a0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2990);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)pvVar14,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_29f8,pvVar14);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::CmpHelperSTREQ
                        ((internal *)local_29d8,"\"0x0001\"",
                         "json[\"0x0000000000000001\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0001",pcVar6);
              std::__cxx11::string::~string((string *)&local_29f8);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_29d8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2a00);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_29d8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_19.message_,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ac,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_19.message_,&local_2a00);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&gtest_ar_19.message_);
                testing::Message::~Message(&local_2a00);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_29d8);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)pvVar14,"PanId");
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::
              get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2a38,pvVar14);
              pcVar6 = (char *)std::__cxx11::string::c_str();
              testing::internal::CmpHelperSTREQ
                        ((internal *)local_2a18,"\"0x0002\"",
                         "json[\"0x0000000000000002\"][\"PanId\"].get<std::string>().c_str()",
                         "0x0002",pcVar6);
              std::__cxx11::string::~string((string *)&local_2a38);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a18)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2a40);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a18);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)
                           &policies[1].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ad,pcVar6);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)
                           &policies[1].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage,&local_2a40);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)
                           &policies[1].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
                testing::Message::~Message(&local_2a40);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a18);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_3900 = (SecurityPolicy *)&gtest_ar_20.message_;
              do {
                ot::commissioner::SecurityPolicy::SecurityPolicy(local_3900);
                local_3900 = local_3900 + 1;
              } while (local_3900 !=
                       (SecurityPolicy *)
                       &policies[1].mFlags.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
              local_2b96 = 1;
              local_2b90 = &local_2b88;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2b88,"opdataset",&local_2b91);
              local_2b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b68;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b68,"set",&local_2b92);
              local_2b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b48;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b48,"securitypolicy",&local_2b93);
              local_2b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b28;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b28,"3",&local_2b94);
              local_2b90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_2b08;
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_2b08,"AB",&local_2b95);
              local_2b96 = 0;
              local_2ae8 = &local_2b88;
              local_2ae0 = (_func_int **)0x5;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_2b97);
              __l_02._M_len = (size_type)local_2ae0;
              __l_02._M_array = local_2ae8;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_2ad8,__l_02,&local_2b97);
              local_2bd0.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)0x1;
              local_2bd0.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2;
              local_2bc0 = &local_2bd0;
              local_2bb8 = (_func_int **)0x2;
              std::allocator<unsigned_long>::allocator(&local_2bd1);
              __l_01._M_len = (size_type)local_2bb8;
              __l_01._M_array = (iterator)local_2bc0;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_2bb0,__l_01,&local_2bd1);
              ot::commissioner::JobManager::PrepareJobs
                        (&local_2ac0,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_2ad8,
                         &local_2bb0,false);
              local_2bd8 = kNone;
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_2a98,
                         "ctx.mJobManager.PrepareJobs({\"opdataset\", \"set\", \"securitypolicy\", \"3\", \"AB\"}, {0x1, 0x2}, false).mCode"
                         ,"ErrorCode::kNone",&local_2ac0.mCode,&local_2bd8);
              ot::commissioner::Error::~Error(&local_2ac0);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2bb0);
              std::allocator<unsigned_long>::~allocator(&local_2bd1);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2ad8);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_2b97);
              local_3980 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_2ae8;
              do {
                local_3980 = local_3980 + -1;
                std::__cxx11::string::~string((string *)local_3980);
              } while (local_3980 != &local_2b88);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b95);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b94);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b93);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b92);
              std::allocator<char>::~allocator((allocator<char> *)&local_2b91);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2a98)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2be0);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2a98);
                testing::internal::AssertHelper::AssertHelper
                          (&local_2be8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2b3,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2be8,&local_2be0);
                testing::internal::AssertHelper::~AssertHelper(&local_2be8);
                testing::Message::~Message(&local_2be0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2a98);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2c20,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_SetSecurityPolicy(&local_2c08,peVar9,&local_2c20);
              testing::internal::GetWithoutMatchers();
              pMVar19 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::operator()(&local_2c08,&local_2c21,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[0]";
              pTVar20 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  (pMVar19,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b4,"*commissionerAppMocks[0]","SetSecurityPolicy(_)");
              local_2c70.policies = (SecurityPolicy (*) [2])&gtest_ar_20.message_;
              local_2c68.policies =
                   (SecurityPolicy (*) [2])
                   testing::
                   WithArgs<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:693:37)>
                             (&local_2c70);
              ot::commissioner::Error::Error(&local_2ca8);
              testing::Return<ot::commissioner::Error>((testing *)&local_2c80,&local_2ca8);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__5,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_2c60,(testing *)&local_2c68,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:693:37),_0UL>
                          *)&local_2c80,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_2c48,(DoAllAction *)&local_2c60);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar20,&local_2c48);
              testing::Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              ~Action(&local_2c48);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:693:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_2c60);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_2c80);
              ot::commissioner::Error::~Error(&local_2ca8);
              testing::internal::
              MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              ~MockSpec(&local_2c08);
              testing::Matcher<const_ot::commissioner::SecurityPolicy_&>::~Matcher(&local_2c20);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              testing::internal::AnythingMatcher::operator_cast_to_Matcher
                        (&local_2ce0,(AnythingMatcher *)&testing::_);
              CommissionerAppMock::gmock_SetSecurityPolicy(&local_2cc8,peVar9,&local_2ce0);
              testing::internal::GetWithoutMatchers();
              pMVar19 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::operator()(&local_2cc8,&local_2ce1,(void *)0x0);
              pcVar6 = "*commissionerAppMocks[1]";
              pTVar20 = testing::internal::
                        MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>
                        ::InternalExpectedAt
                                  (pMVar19,
                                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                                   ,0x2b6,"*commissionerAppMocks[1]","SetSecurityPolicy(_)");
              local_2d30.policies = (SecurityPolicy (*) [2])&gtest_ar_20.message_;
              local_2d28.policies =
                   (SecurityPolicy (*) [2])
                   testing::
                   WithArgs<0UL,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:695:37)>
                             (&local_2d30);
              ot::commissioner::Error::Error(&local_2d68);
              testing::Return<ot::commissioner::Error>((testing *)&local_2d40,&local_2d68);
              testing::
              DoAll<testing::internal::WithArgsAction<JobManagerTestSuite_BuildFinalResultString_Test::TestBody()::__6,0ul>,testing::internal::ReturnAction<ot::commissioner::Error>>
                        (&local_2d20,(testing *)&local_2d28,
                         (WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:695:37),_0UL>
                          *)&local_2d40,(ReturnAction<ot::commissioner::Error> *)pcVar6);
              testing::internal::DoAllAction::operator_cast_to_Action
                        (&local_2d08,(DoAllAction *)&local_2d20);
              testing::internal::
              TypedExpectation<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              WillOnce(pTVar20,&local_2d08);
              testing::Action<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              ~Action(&local_2d08);
              testing::internal::
              DoAllAction<testing::internal::WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:695:37),_0UL>,_testing::internal::ReturnAction<ot::commissioner::Error>_>
              ::~DoAllAction(&local_2d20);
              testing::internal::ReturnAction<ot::commissioner::Error>::~ReturnAction(&local_2d40);
              ot::commissioner::Error::~Error(&local_2d68);
              testing::internal::
              MockSpec<ot::commissioner::Error_(const_ot::commissioner::SecurityPolicy_&)>::
              ~MockSpec(&local_2cc8);
              testing::Matcher<const_ot::commissioner::SecurityPolicy_&>::~Matcher(&local_2ce0);
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        (&local_2db0,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::operator=((Value *)&json.m_value,&local_2db0);
              ot::commissioner::Interpreter::Value::~Value(&local_2db0);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_2df0,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_2dd0,&local_2df0);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar__15.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_2dc0,&local_2dd0,(parser_callback_t *)&gtest_ar__15.message_,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_1cd8,&local_2dc0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_2dc0);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar__15.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_2dd0);
              std::__cxx11::string::~string((string *)&local_2df0);
              local_2e21 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2e20,&local_2e21,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e20)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2e30);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__16.message_,(internal *)local_2e20,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2e38,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,699,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2e38,&local_2e30);
                testing::internal::AssertHelper::~AssertHelper(&local_2e38);
                std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                testing::Message::~Message(&local_2e30);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e20);
              local_2e69 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_2e68,&local_2e69,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2e68)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2e78);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__17.message_,(internal *)local_2e68,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2e80,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,700,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2e80,&local_2e78);
                testing::internal::AssertHelper::~AssertHelper(&local_2e80);
                std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                testing::Message::~Message(&local_2e78);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2e68);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_2eb0,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2eb0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2eb8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__18.message_,(internal *)local_2eb0,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2ec0,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2bd,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2ec0,&local_2eb8);
                testing::internal::AssertHelper::~AssertHelper(&local_2ec0);
                std::__cxx11::string::~string((string *)&gtest_ar__18.message_);
                testing::Message::~Message(&local_2eb8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2eb0);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_2ef0,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2ef0)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_2ef8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_21.message_,(internal *)local_2ef0,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_2f00,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2be,pcVar6);
                testing::internal::AssertHelper::operator=(&local_2f00,&local_2ef8);
                testing::internal::AssertHelper::~AssertHelper(&local_2f00);
                std::__cxx11::string::~string((string *)&gtest_ar_21.message_);
                testing::Message::~Message(&local_2ef8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2ef0);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_2faa = 1;
              local_2fa8 = &local_2fa0;
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)&local_2fa0,"stop",&local_2fa9);
              local_2faa = 0;
              local_2f80 = &local_2fa0;
              local_2f78 = (_Base_ptr)0x1;
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::allocator(&local_2fab);
              __l_00._M_len = (size_type)local_2f78;
              __l_00._M_array = (iterator)local_2f80;
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::vector(&local_2f70,__l_00,&local_2fab);
              local_2fe8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
              local_2fe0 = (pointer)0x2;
              local_2fd8 = &local_2fe8;
              local_2fd0 = (pointer)0x2;
              std::allocator<unsigned_long>::allocator
                        ((allocator<unsigned_long> *)(local_2ff8 + 0xf));
              __l._M_len = (size_type)local_2fd0;
              __l._M_array = (iterator)local_2fd8;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                        (&local_2fc8,__l,(allocator<unsigned_long> *)(local_2ff8 + 0xf));
              ot::commissioner::JobManager::PrepareJobs
                        (&local_2f58,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1),&local_2f70,
                         &local_2fc8,false);
              local_2ff8._8_4_ = 0;
              pcVar6 = "ctx.mJobManager.PrepareJobs({\"stop\"}, {0x1, 0x2}, false).mCode";
              testing::internal::EqHelper::
              Compare<ot::commissioner::ErrorCode,_ot::commissioner::ErrorCode,_nullptr>
                        ((EqHelper *)local_2f30,
                         "ctx.mJobManager.PrepareJobs({\"stop\"}, {0x1, 0x2}, false).mCode",
                         "ErrorCode::kNone",&local_2f58.mCode,(ErrorCode *)(local_2ff8 + 8));
              ot::commissioner::Error::~Error(&local_2f58);
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector(&local_2fc8);
              std::allocator<unsigned_long>::~allocator
                        ((allocator<unsigned_long> *)(local_2ff8 + 0xf));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&local_2f70);
              std::
              allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~allocator(&local_2fab);
              local_3a90 = (_Rb_tree_node_base *)&local_2f80;
              do {
                local_3a90 = local_3a90 + -1;
                std::__cxx11::string::~string((string *)local_3a90);
              } while (local_3a90 != &local_2fa0);
              std::allocator<char>::~allocator((allocator<char> *)&local_2fa9);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f30)
              ;
              if (!bVar2) {
                testing::Message::Message((Message *)local_2ff8);
                pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_2f30);
                testing::internal::AssertHelper::AssertHelper
                          (&local_3000,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c2,pcVar6);
                pcVar6 = local_2ff8;
                testing::internal::AssertHelper::operator=(&local_3000,(Message *)pcVar6);
                testing::internal::AssertHelper::~AssertHelper(&local_3000);
                testing::Message::~Message((Message *)local_2ff8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f30);
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)local_1638);
              local_3010.function_mocker_ =
                   (FunctionMocker<void_()> *)
                   CommissionerAppMock::gmock_Stop
                             ((MockSpec<void_()> *)peVar9,(CommissionerAppMock *)pcVar6);
              testing::internal::GetWithoutMatchers();
              pMVar21 = testing::internal::MockSpec<void_()>::operator()
                                  (&local_3010,&local_3011,(void *)0x0);
              pcVar6 = 
              "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
              ;
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        (pMVar21,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c3,"*commissionerAppMocks[0]","Stop()");
              peVar9 = std::
                       __shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator*((__shared_ptr_access<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&commissionerAppMocks[0].
                                       super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount);
              local_3028.function_mocker_ =
                   (FunctionMocker<void_()> *)
                   CommissionerAppMock::gmock_Stop
                             ((MockSpec<void_()> *)peVar9,(CommissionerAppMock *)pcVar6);
              testing::internal::GetWithoutMatchers();
              pMVar21 = testing::internal::MockSpec<void_()>::operator()
                                  (&local_3028,&local_3029,(void *)0x0);
              testing::internal::MockSpec<void_()>::InternalExpectedAt
                        (pMVar21,
                         "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                         ,0x2c4,"*commissionerAppMocks[1]","Stop()");
              ot::commissioner::JobManager::RunJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::JobManager::CollectJobsValue
                        (&local_3078,(JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              ot::commissioner::Interpreter::Value::operator=((Value *)&json.m_value,&local_3078);
              ot::commissioner::Interpreter::Value::~Value(&local_3078);
              ot::commissioner::Interpreter::Value::ToString_abi_cxx11_
                        (&local_30b8,(Value *)&json.m_value);
              nlohmann::detail::input_adapter::
              input_adapter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (&local_3098,&local_30b8);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                          *)&gtest_ar__19.message_,(nullptr_t)0x0);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::parse(&local_3088,&local_3098,(parser_callback_t *)&gtest_ar__19.message_,true);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           *)local_1cd8,&local_3088);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json(&local_3088);
              std::
              function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
              ::~function((function<bool_(int,_nlohmann::detail::parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>::parse_event_t,_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_&)>
                           *)&gtest_ar__19.message_);
              nlohmann::detail::input_adapter::~input_adapter(&local_3098);
              std::__cxx11::string::~string((string *)&local_30b8);
              local_30e9 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000001");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_30e8,&local_30e9,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30e8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_30f8);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__20.message_,(internal *)local_30e8,
                           (AssertionResult *)"json.contains(\"0x0000000000000001\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3100,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c8,pcVar6);
                testing::internal::AssertHelper::operator=(&local_3100,&local_30f8);
                testing::internal::AssertHelper::~AssertHelper(&local_3100);
                std::__cxx11::string::~string((string *)&gtest_ar__20.message_);
                testing::Message::~Message(&local_30f8);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_30e8);
              local_3131 = nlohmann::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                           ::contains<const_char_(&)[19],_0>
                                     ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_1cd8,(char (*) [19])"0x0000000000000002");
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_3130,&local_3131,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3130)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_3140);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__21.message_,(internal *)local_3130,
                           (AssertionResult *)"json.contains(\"0x0000000000000002\")","false","true"
                           ,pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3148,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2c9,pcVar6);
                testing::internal::AssertHelper::operator=(&local_3148,&local_3140);
                testing::internal::AssertHelper::~AssertHelper(&local_3148);
                std::__cxx11::string::~string((string *)&gtest_ar__21.message_);
                testing::Message::~Message(&local_3140);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3130);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000001");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_3178,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3178)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_3180);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__22.message_,(internal *)local_3178,
                           (AssertionResult *)"json[\"0x0000000000000001\"]","false","true",pcVar5);
                pcVar6 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_3188,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2ca,pcVar6);
                testing::internal::AssertHelper::operator=(&local_3188,&local_3180);
                testing::internal::AssertHelper::~AssertHelper(&local_3188);
                std::__cxx11::string::~string((string *)&gtest_ar__22.message_);
                testing::Message::~Message(&local_3180);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_3178);
              pvVar14 = nlohmann::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                        ::operator[]<char_const>
                                  ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                                    *)local_1cd8,"0x0000000000000002");
              testing::AssertionResult::
              AssertionResult<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>
                        ((AssertionResult *)local_31b8,pvVar14,(type *)0x0);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_31b8)
              ;
              if (!bVar2) {
                testing::Message::Message(&local_31c0);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          (&local_31e8,(internal *)local_31b8,
                           (AssertionResult *)"json[\"0x0000000000000002\"]","false","true",pcVar5);
                pcVar5 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_31c8,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp"
                           ,0x2cb,pcVar5);
                testing::internal::AssertHelper::operator=(&local_31c8,&local_31c0);
                testing::internal::AssertHelper::~AssertHelper(&local_31c8);
                std::__cxx11::string::~string((string *)&local_31e8);
                testing::Message::~Message(&local_31c0);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_31b8);
              ot::commissioner::JobManager::CleanupJobs
                        ((JobManager *)(ctx.mInterpreter.mCancelPipe + 1));
              local_3b58 = (SecurityPolicy *)
                           &policies[1].mFlags.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage;
              do {
                local_3b58 = local_3b58 + -1;
                ot::commissioner::SecurityPolicy::~SecurityPolicy(local_3b58);
              } while (local_3b58 != (SecurityPolicy *)&gtest_ar_20.message_);
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                             *)local_1cd8);
              ot::commissioner::Interpreter::Value::~Value((Value *)&json.m_value);
              local_3b70 = &commissionerAppMocks[2].
                            super___shared_ptr<CommissionerAppMock,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount;
              do {
                local_3b70 = local_3b70 + -2;
                std::shared_ptr<CommissionerAppMock>::~shared_ptr
                          ((shared_ptr<CommissionerAppMock> *)local_3b70);
              } while (local_3b70 != (__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_1638);
              gtest_ar_1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ = 0;
            }
          }
        }
      }
    }
  }
  JobManagerTestSuite::TestContext::~TestContext((TestContext *)local_3d8);
  return;
}

Assistant:

TEST_F(JobManagerTestSuite, BuildFinalResultString)
{
    TestContext ctx;
    SetInitialExpectations(ctx);

    // Formally set default PSKc
    ctx.mConf.mPSKc = {'1', '0'};

    using namespace ot::commissioner::persistent_storage;
    // Prepare test data
    NetworkId      nid;
    BorderRouterId rid;

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan1", 1, 1, 0x1, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 0);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan2", 2, 2, 0x2, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20002, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 1);

    ASSERT_EQ(ctx.mPS->Add(Network{0, 0, "pan3", 3, 3, 0x3, "", 0}, nid), PersistentStorage::Status::kSuccess);
    EXPECT_EQ(nid.mId, 2);

    ASSERT_EQ(ctx.mPS->Add(BorderRouter{0, nid,
                                        BorderAgent{"127.0.0.1", 20003, ByteArray{}, "1.1",
                                                    BorderAgent::State{0, 0, 0, 0, 0}, "", 0, "", "",
                                                    Timestamp{0, 0, 0}, 0, "", ByteArray{}, "", 0, 0, "", 0, 0x0F}},
                           rid),
              PersistentStorage::Status::kSuccess);
    EXPECT_EQ(rid.mId, 2);

    Init(ctx, ".");

    uint8_t                camIdx                  = 0;
    CommissionerAppMockPtr commissionerAppMocks[3] = {CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()},
                                                      CommissionerAppMockPtr{new CommissionerAppMock()}};

    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .Times(3)
        .WillRepeatedly(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMocks[camIdx++]; }),
                  Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[0], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[1], IsActive()).WillOnce(Return(false)).WillRepeatedly(Return(true));
    EXPECT_CALL(*commissionerAppMocks[2], IsActive()).WillRepeatedly(Return(false));

    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"start"}, {0x1, 0x02, 0x03}, false).mCode, ErrorCode::kNone);

    EXPECT_CALL(*commissionerAppMocks[0], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[1], Start(_, _, _)).Times(1).WillOnce(Return(Error{}));
    EXPECT_CALL(*commissionerAppMocks[2], Start(_, _, _))
        .Times(1)
        .WillOnce(Return(Error{ErrorCode::kAborted, "Aborted"}));

    ctx.mJobManager.RunJobs();

    Interpreter::Value value = ctx.mJobManager.CollectJobsValue();
    nlohmann::json     json  = nlohmann::json::parse(value.ToString());

    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_FALSE(json.contains("0x0000000000000003"));
    ctx.mJobManager.CleanupJobs();

    // "active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"active"}, {0x1, 0x2, 0x3}, false).mCode, ErrorCode::kNone);
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json.contains("0x0000000000000003"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    EXPECT_FALSE(json["0x0000000000000003"]);
    ctx.mJobManager.CleanupJobs();

    // "sessionid" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"sessionid"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 0; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetSessionId(_))
        .WillOnce(DoAll(WithArg<0>([](uint16_t &a) { a = 1; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_EQ(json["0x0000000000000001"], 0);
    EXPECT_EQ(json["0x0000000000000002"], 1);
    ctx.mJobManager.CleanupJobs();

    // "opdataset get active" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "get", "active"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 1;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], GetActiveDataset(_, _))
        .WillOnce(DoAll(WithArgs<0>([](ActiveOperationalDataset &ods) {
                            ods.mPanId        = 2;
                            ods.mPresentFlags = ActiveOperationalDataset::kPanIdBit;
                        }),
                        Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"].contains("PanId"));
    EXPECT_TRUE(json["0x0000000000000002"].contains("PanId"));
    EXPECT_STREQ("0x0001", json["0x0000000000000001"]["PanId"].get<std::string>().c_str());
    EXPECT_STREQ("0x0002", json["0x0000000000000002"]["PanId"].get<std::string>().c_str());
    ctx.mJobManager.CleanupJobs();

    // "opdataset set securitypolicy" command
    SecurityPolicy policies[2];
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"opdataset", "set", "securitypolicy", "3", "AB"}, {0x1, 0x2}, false).mCode,
              ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[0] = pol; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMocks[1], SetSecurityPolicy(_))
        .WillOnce(DoAll(WithArgs<0>([&policies](const SecurityPolicy &pol) { policies[1] = pol; }), Return(Error{})));
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();

    // "stop" command
    EXPECT_EQ(ctx.mJobManager.PrepareJobs({"stop"}, {0x1, 0x2}, false).mCode, ErrorCode::kNone);
    EXPECT_CALL(*commissionerAppMocks[0], Stop());
    EXPECT_CALL(*commissionerAppMocks[1], Stop());
    ctx.mJobManager.RunJobs();
    value = ctx.mJobManager.CollectJobsValue();
    json  = nlohmann::json::parse(value.ToString());
    EXPECT_TRUE(json.contains("0x0000000000000001"));
    EXPECT_TRUE(json.contains("0x0000000000000002"));
    EXPECT_TRUE(json["0x0000000000000001"]);
    EXPECT_TRUE(json["0x0000000000000002"]);
    ctx.mJobManager.CleanupJobs();
}